

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qplatformsharedgraphicscache.cpp
# Opt level: O0

int __thiscall
QPlatformSharedGraphicsCache::qt_metacall
          (QPlatformSharedGraphicsCache *this,Call _c,int _id,void **_a)

{
  uint in_EDX;
  int in_ESI;
  Call in_EDI;
  void **in_stack_00000030;
  int in_stack_00000038;
  Call in_stack_0000003c;
  QObject *in_stack_00000040;
  undefined4 local_18;
  undefined4 local_4;
  
  local_18 = QObject::qt_metacall(in_EDI,in_ESI,(void **)(ulong)in_EDX);
  local_4 = local_18;
  if (-1 < local_18) {
    if (in_ESI == 0) {
      if (local_18 < 4) {
        qt_static_metacall(in_stack_00000040,in_stack_0000003c,in_stack_00000038,in_stack_00000030);
      }
      local_18 = local_18 + -4;
    }
    if (in_ESI == 7) {
      if (local_18 < 4) {
        qt_static_metacall(in_stack_00000040,in_stack_0000003c,in_stack_00000038,in_stack_00000030);
      }
      local_18 = local_18 + -4;
    }
    local_4 = local_18;
  }
  return local_4;
}

Assistant:

int QPlatformSharedGraphicsCache::qt_metacall(QMetaObject::Call _c, int _id, void **_a)
{
    _id = QObject::qt_metacall(_c, _id, _a);
    if (_id < 0)
        return _id;
    if (_c == QMetaObject::InvokeMetaMethod) {
        if (_id < 4)
            qt_static_metacall(this, _c, _id, _a);
        _id -= 4;
    }
    if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        if (_id < 4)
            qt_static_metacall(this, _c, _id, _a);
        _id -= 4;
    }
    return _id;
}